

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O3

unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true> __thiscall
duckdb::TableDataWriter::CreateTaskExecutor(TableDataWriter *this)

{
  ClientContext *context_p;
  TaskExecutor *this_00;
  Catalog *this_01;
  DatabaseInstance *db;
  TaskScheduler *scheduler;
  long in_RSI;
  
  if (*(long *)(in_RSI + 0x10) == 0) {
    this_01 = (Catalog *)(**(code **)(**(long **)(in_RSI + 8) + 0x58))();
    db = Catalog::GetDatabase(this_01);
    scheduler = TaskScheduler::GetScheduler(db);
    this_00 = (TaskExecutor *)operator_new(0x70);
    TaskExecutor::TaskExecutor(this_00,scheduler);
  }
  else {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid
              ((optional_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x10));
    context_p = ((optional_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x10))->ptr;
    this_00 = (TaskExecutor *)operator_new(0x70);
    TaskExecutor::TaskExecutor(this_00,context_p);
  }
  this->_vptr_TableDataWriter = (_func_int **)this_00;
  return (unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>)
         (unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>_>)this;
}

Assistant:

unique_ptr<TaskExecutor> TableDataWriter::CreateTaskExecutor() {
	if (client_context) {
		return make_uniq<TaskExecutor>(*client_context);
	}
	return make_uniq<TaskExecutor>(TaskScheduler::GetScheduler(GetDatabase()));
}